

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O1

IGUIElement * __thiscall
irr::gui::IGUIElement::getElementFromPoint(IGUIElement *this,vector2d<int> *point)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  int iVar4;
  IGUIElement *pIVar5;
  IGUIElement *pIVar6;
  bool bVar7;
  
  iVar4 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[0xd])();
  if ((char)iVar4 == '\0') {
    pIVar6 = (IGUIElement *)0x0;
  }
  else {
    pIVar5 = (IGUIElement *)&this->Children;
    p_Var1 = (this->Children).
             super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    bVar7 = pIVar5 == (IGUIElement *)p_Var1;
    if (bVar7) {
      pIVar6 = (IGUIElement *)0x0;
    }
    else {
      p_Var2 = (this->Children).
               super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>.
               _M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
      pIVar5 = (IGUIElement *)(*(code *)p_Var2->_M_next[2]._M_next)(p_Var2,point);
      pIVar6 = pIVar5;
      if (pIVar5 == (IGUIElement *)0x0) {
        p_Var2 = &(this->Children).
                  super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                  ._M_impl._M_node.super__List_node_base;
        do {
          p_Var2 = p_Var2->_M_prev;
          bVar7 = p_Var2 == p_Var1;
          if (bVar7) {
            pIVar6 = (IGUIElement *)0x0;
            break;
          }
          p_Var3 = p_Var2->_M_prev[1]._M_next;
          pIVar5 = (IGUIElement *)(*(code *)p_Var3->_M_next[2]._M_next)(p_Var3,point);
          pIVar6 = pIVar5;
        } while (pIVar5 == (IGUIElement *)0x0);
      }
    }
    if (!bVar7) {
      return pIVar5;
    }
  }
  iVar4 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[0xd])(this);
  if (((char)iVar4 != '\0') &&
     (iVar4 = (*(this->super_IEventReceiver)._vptr_IEventReceiver[5])(this,point),
     (char)iVar4 != '\0')) {
    pIVar6 = this;
  }
  return pIVar6;
}

Assistant:

virtual IGUIElement *getElementFromPoint(const core::position2d<s32> &point)
	{
		IGUIElement *target = 0;

		if (isVisible()) {
			// we have to search from back to front, because later children
			// might be drawn over the top of earlier ones.
			auto it = Children.rbegin();
			auto ie = Children.rend();
			while (it != ie) {
				target = (*it)->getElementFromPoint(point);
				if (target)
					return target;

				++it;
			}
		}

		if (isVisible() && isPointInside(point))
			target = this;

		return target;
	}